

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bandpre.c
# Opt level: O3

int CVBandPrecGetWorkSpace(void *cvode_mem,long *lenrwBP,long *leniwBP)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    iVar2 = 0xe1;
  }
  else if (*(long *)((long)cvode_mem + 0x7e0) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar3 = -2;
    error_code = -2;
    iVar2 = 0xe9;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x7e0) + 0xf0);
    if (lVar1 != 0) {
      *leniwBP = 4;
      *lenrwBP = 0;
      if (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8) + 0x20) != 0) {
        N_VSpace(*(long *)((long)cvode_mem + 0x1d0),&local_38,&local_40);
        *leniwBP = *leniwBP + local_40 * 2;
        *lenrwBP = *lenrwBP + local_38 * 2;
      }
      if (*(long *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0x50) != 0) {
        iVar2 = SUNMatSpace(*(long *)(lVar1 + 0x18),&local_48,&local_50);
        if (iVar2 != 0) {
          return -1;
        }
        *leniwBP = *leniwBP + local_50;
        *lenrwBP = *lenrwBP + local_48;
      }
      if (*(long *)(*(long *)(*(long *)(lVar1 + 0x20) + 8) + 0x50) != 0) {
        iVar2 = SUNMatSpace(*(long *)(lVar1 + 0x20),&local_48,&local_50);
        if (iVar2 != 0) {
          return -1;
        }
        *leniwBP = *leniwBP + local_50;
        *lenrwBP = *lenrwBP + local_48;
      }
      if (*(long *)(*(long *)(*(long *)(lVar1 + 0x28) + 8) + 0x60) == 0) {
        return 0;
      }
      iVar2 = SUNLinSolSpace(*(long *)(lVar1 + 0x28),&local_48,&local_50);
      if (iVar2 != 0) {
        return -1;
      }
      *leniwBP = *leniwBP + local_50;
      *lenrwBP = *lenrwBP + local_48;
      return 0;
    }
    msgfmt = "Band preconditioner memory is NULL. CVBandPrecInit must be called.";
    iVar3 = -5;
    error_code = -5;
    iVar2 = 0xf1;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVBandPrecGetWorkSpace",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_bandpre.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVBandPrecGetWorkSpace(void* cvode_mem, long int* lenrwBP, long int* leniwBP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBandPrecData pdata;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBandPrecData)cvls_mem->P_data;

  /* sum space requirements for all objects in pdata */
  *leniwBP = 4;
  *lenrwBP = 0;
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *leniwBP += 2 * liw1;
    *lenrwBP += 2 * lrw1;
  }
  if (pdata->savedJ->ops->space)
  {
    flag = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }
  if (pdata->savedP->ops->space)
  {
    flag = SUNMatSpace(pdata->savedP, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }

  return (CVLS_SUCCESS);
}